

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_int.c
# Opt level: O1

int mpt_cuint(uint *val,char *src,int base,uint *range)

{
  int iVar1;
  undefined8 in_RAX;
  int iVar2;
  uint tmp;
  uint local_14;
  
  local_14 = (uint)((ulong)in_RAX >> 0x20);
  iVar1 = _mpt_convert_uint(&local_14,4,src,base);
  iVar2 = iVar1;
  if ((0 < iVar1) &&
     (((range == (uint *)0x0 || ((iVar2 = -2, *range <= local_14 && (local_14 <= range[1])))) &&
      (iVar2 = iVar1, val != (uint *)0x0)))) {
    *val = local_14;
  }
  return iVar2;
}

Assistant:

extern int _mpt_convert_uint(void *val, size_t vlen, const char *src, int base)
{
	uintmax_t tmp;
	char *end;
	
	if (!(end = (char *) src)) {
		return MPT_ERROR(BadArgument);
	}
	if (!*src) {
		return 0;
	}
	/* max size unsigend integer */
	tmp = strtoumax(src, &end, base);
	if (end == src) {
		/* accept space as empty string */
		while (*src) {
			if (!isspace(*src++)) {
				return MPT_ERROR(BadType);
			}
		}
		return 0;
	}
	switch (vlen) {
	  case sizeof(int8_t) :
		if (tmp > UINT8_MAX) {
			return MPT_ERROR(BadValue);
		}
		if (val) *((int8_t *) val) = tmp;
		break;
	  case sizeof(int16_t):
		if (tmp > UINT16_MAX) {
			return MPT_ERROR(BadValue);
		}
		if (val) *((int16_t *) val) = tmp;
		break;
	  case sizeof(int32_t):
		if (tmp > UINT32_MAX) {
			return MPT_ERROR(BadValue);
		}
		if (val) *((int32_t *) val) = tmp;
		break;
	  case sizeof(int64_t):
		if (tmp > UINT64_MAX) {
			return MPT_ERROR(BadValue);
		}
		if (val) *((int64_t *) val) = tmp;
		break;
	  default:
		return MPT_ERROR(BadType);
	}
	return end - src;
}